

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::RunInTerminalRequest>::construct
          (BasicTypeInfo<dap::RunInTerminalRequest> *this,void *ptr)

{
  memset(ptr,0,0xd0);
  *(long *)((long)ptr + 0x20) = (long)ptr + 0x30;
  *(undefined1 *)((long)ptr + 0x30) = 0;
  *(long *)((long)ptr + 0x40) = (long)ptr + 0x70;
  *(undefined8 *)((long)ptr + 0x48) = 1;
  *(undefined8 *)((long)ptr + 0x50) = 0;
  *(undefined8 *)((long)ptr + 0x58) = 0;
  *(undefined4 *)((long)ptr + 0x60) = 0x3f800000;
  *(undefined8 *)((long)ptr + 0x68) = 0;
  *(undefined8 *)((long)ptr + 0x70) = 0;
  *(undefined1 *)((long)ptr + 0x78) = 0;
  *(long *)((long)ptr + 0x80) = (long)ptr + 0x90;
  *(undefined1 *)((long)ptr + 0x90) = 0;
  *(long *)((long)ptr + 0xa8) = (long)ptr + 0xb8;
  *(undefined1 *)((long)ptr + 0xb8) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }